

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

bool __thiscall flatbuffers::Parser::SetRootType(Parser *this,char *name)

{
  StructDef *pSVar1;
  allocator local_31;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,name,&local_31);
  pSVar1 = SymbolTable<flatbuffers::StructDef>::Lookup(&this->structs_,&local_30);
  this->root_struct_def = pSVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return this->root_struct_def != (StructDef *)0x0;
}

Assistant:

bool Parser::SetRootType(const char *name) {
  root_struct_def = structs_.Lookup(name);
  return root_struct_def != nullptr;
}